

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

void pbrt::SetSearchDirectory(string *filename)

{
  bool bVar1;
  path path;
  path pStack_58;
  path local_30;
  
  filesystem::path::path(&pStack_58,filename);
  bVar1 = filesystem::path::is_directory(&pStack_58);
  if (!bVar1) {
    filesystem::path::parent_path(&local_30,&pStack_58);
    filesystem::path::operator=(&pStack_58,&local_30);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_30.m_path);
  }
  filesystem::path::operator=((path *)searchDirectory,&pStack_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&pStack_58.m_path);
  return;
}

Assistant:

void SetSearchDirectory(const std::string &filename) {
    filesystem::path path(filename);
    if (!path.is_directory())
        path = path.parent_path();
    searchDirectory = path;
}